

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

spv_result_t spvtools::val::anon_unknown_2::ValidateEntryPoints(ValidationState_t *_)

{
  _Rb_tree_header *p_Var1;
  uint32_t *puVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  Instruction *pIVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  spv_result_t unaff_R13D;
  uint *entry_point;
  uint32_t *puVar10;
  string local_228;
  DiagnosticStream local_208;
  
  ValidationState_t::ComputeFunctionToEntryPointMapping(_);
  ValidationState_t::ComputeRecursiveEntryPoints(_);
  if (((_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     (bVar3 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityLinkage), bVar3)
     ) {
    puVar10 = (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bVar3 = puVar10 == puVar2;
    unaff_R13D = unaff_R13D;
    if (!bVar3) {
      p_Var1 = &(_->recursive_entry_points_)._M_t._M_impl.super__Rb_tree_header;
      do {
        bVar4 = ValidationState_t::IsFunctionCallTarget(_,*puVar10);
        if (bVar4) {
          pIVar6 = ValidationState_t::FindDef(_,*puVar10);
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,pIVar6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,"A function (",0xc);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,
                     ") may not be targeted by both an OpEntryPoint instruction and an OpFunctionCall instruction."
                     ,0x5c);
          unaff_R13D = local_208.error_;
LAB_005f9057:
          DiagnosticStream::~DiagnosticStream(&local_208);
          bVar4 = false;
        }
        else {
          bVar5 = spvIsVulkanEnv(_->context_->target_env);
          bVar4 = true;
          if (bVar5) {
            p_Var8 = (_->recursive_entry_points_)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent;
            p_Var7 = &p_Var1->_M_header;
            if (p_Var8 != (_Base_ptr)0x0) {
              do {
                bVar5 = (uint)*(size_t *)(p_Var8 + 1) < *puVar10;
                if (!bVar5) {
                  p_Var7 = p_Var8;
                }
                p_Var8 = (&p_Var8->_M_left)[bVar5];
              } while (p_Var8 != (_Base_ptr)0x0);
            }
            p_Var9 = p_Var1;
            if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
               (p_Var9 = (_Rb_tree_header *)p_Var7,
               *puVar10 < (uint)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
              p_Var9 = p_Var1;
            }
            if (p_Var9 != p_Var1) {
              pIVar6 = ValidationState_t::FindDef(_,*puVar10);
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,pIVar6);
              ValidationState_t::VkErrorID_abi_cxx11_(&local_228,_,0x121a,(char *)0x0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,local_228._M_dataplus._M_p,local_228._M_string_length
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"Entry points may not have a call graph with cycles."
                         ,0x33);
              unaff_R13D = local_208.error_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_228._M_dataplus._M_p != &local_228.field_2) {
                operator_delete(local_228._M_dataplus._M_p,
                                local_228.field_2._M_allocated_capacity + 1);
              }
              goto LAB_005f9057;
            }
          }
        }
        if (!bVar4) break;
        puVar10 = puVar10 + 1;
        bVar3 = puVar10 == puVar2;
      } while (!bVar3);
    }
    local_208.error_ = unaff_R13D;
    if ((bVar3) && (local_208.error_ = ValidateFloatControls2(_), local_208.error_ == SPV_SUCCESS))
    {
      local_208.error_ = ValidateDuplicateExecutionModes(_);
    }
  }
  else {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,(Instruction *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,
               "No OpEntryPoint instruction was found. This is only allowed if the Linkage capability is being used."
               ,100);
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
  return local_208.error_;
}

Assistant:

spv_result_t ValidateEntryPoints(ValidationState_t& _) {
  _.ComputeFunctionToEntryPointMapping();
  _.ComputeRecursiveEntryPoints();

  if (_.entry_points().empty() && !_.HasCapability(spv::Capability::Linkage)) {
    return _.diag(SPV_ERROR_INVALID_BINARY, nullptr)
           << "No OpEntryPoint instruction was found. This is only allowed if "
              "the Linkage capability is being used.";
  }

  for (const auto& entry_point : _.entry_points()) {
    if (_.IsFunctionCallTarget(entry_point)) {
      return _.diag(SPV_ERROR_INVALID_BINARY, _.FindDef(entry_point))
             << "A function (" << entry_point
             << ") may not be targeted by both an OpEntryPoint instruction and "
                "an OpFunctionCall instruction.";
    }

    // For Vulkan, the static function-call graph for an entry point
    // must not contain cycles.
    if (spvIsVulkanEnv(_.context()->target_env)) {
      if (_.recursive_entry_points().find(entry_point) !=
          _.recursive_entry_points().end()) {
        return _.diag(SPV_ERROR_INVALID_BINARY, _.FindDef(entry_point))
               << _.VkErrorID(4634)
               << "Entry points may not have a call graph with cycles.";
      }
    }
  }

  if (auto error = ValidateFloatControls2(_)) {
    return error;
  }
  if (auto error = ValidateDuplicateExecutionModes(_)) {
    return error;
  }

  return SPV_SUCCESS;
}